

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdRaycastMesh.cpp
# Opt level: O1

bool __thiscall
HACD::BBox::Raycast(BBox *this,Vec3<double> *origin,Vec3<double> *dir,Float *distMin)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  
  dVar1 = (this->m_max).m_data[0];
  dVar2 = (this->m_min).m_data[0];
  dVar3 = (this->m_min).m_data[1];
  dVar12 = (this->m_max).m_data[1];
  dVar5 = dVar12 - dVar3;
  dVar4 = (this->m_max).m_data[2];
  dVar8 = (this->m_min).m_data[2];
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar1 - dVar2;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar5 * dVar5;
  auVar9 = vfmadd231sd_fma(auVar19,auVar15,auVar15);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar4 - dVar8;
  auVar9 = vfmadd231sd_fma(auVar9,auVar23,auVar23);
  dVar5 = auVar9._0_8_ * 0.25;
  dVar6 = (dVar1 * 0.5 + dVar2 * 0.5) - origin->m_data[0];
  dVar7 = (dVar12 * 0.5 + dVar3 * 0.5) - origin->m_data[1];
  dVar4 = (dVar4 * 0.5 + dVar8 * 0.5) - origin->m_data[2];
  dVar1 = dir->m_data[0];
  dVar2 = dir->m_data[1];
  dVar3 = dir->m_data[2];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar7 * dVar7;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar6;
  auVar9 = vfmadd231sd_fma(auVar9,auVar21,auVar21);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar4;
  auVar9 = vfmadd231sd_fma(auVar9,auVar17,auVar17);
  dVar8 = auVar9._0_8_;
  *distMin = dVar8;
  dVar12 = 0.0;
  if (dVar5 < dVar8) {
    if (dVar8 < 0.0) {
      dVar12 = sqrt(dVar8);
    }
    else {
      auVar9 = vsqrtsd_avx(auVar9,auVar9);
      dVar12 = auVar9._0_8_;
    }
    auVar24._8_8_ = 0;
    auVar24._0_8_ = dVar5;
    if (dVar5 < 0.0) {
      dVar8 = sqrt(dVar5);
    }
    else {
      auVar9 = vsqrtsd_avx(auVar24,auVar24);
      dVar8 = auVar9._0_8_;
    }
    dVar12 = dVar12 - dVar8;
  }
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar3;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar1;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar4;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar6;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar7 * dVar2;
  auVar9 = vfmadd231sd_fma(auVar10,auVar20,auVar22);
  auVar9 = vfmadd231sd_fma(auVar9,auVar16,auVar13);
  dVar8 = auVar9._0_8_;
  dVar7 = dVar7 - dVar2 * dVar8;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar7 * dVar7;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar6 - dVar1 * dVar8;
  auVar9 = vfmadd231sd_fma(auVar11,auVar18,auVar18);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar4 - dVar3 * dVar8;
  auVar9 = vfmadd231sd_fma(auVar9,auVar14,auVar14);
  *distMin = dVar12;
  return auVar9._0_8_ <= dVar5;
}

Assistant:

bool BBox::Raycast(const Vec3<Float> & origin, const Vec3<Float> & dir, Float & distMin) const
	{
		Vec3<Float> d = m_max - m_min;
		Float r2 = 0.25 * (d.X()*d.X()+d.Y()*d.Y()+d.Z()*d.Z());
		Vec3<Float> c = 0.5 * m_max + 0.5 * m_min;
		Vec3<Float> u = (c-origin);
		Vec3<Float> a = u - (u * dir) * dir;
		Float dist2 = (a.X()*a.X()+a.Y()*a.Y()+a.Z()*a.Z());
		distMin = (u.X()*u.X()+u.Y()*u.Y()+u.Z()*u.Z());
		if ( distMin > r2 ) // origin outside the sphere of center c and radius r 
		{
			distMin = sqrt(distMin) - sqrt(r2); // the distance to any point inside the sphere is higher than |origin - c| - r
		}
		else
		{
			distMin = 0.0;
		}
		if (dist2 > r2) return false;
		return true;
	}